

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O1

string * ToBinaryPayload_abi_cxx11_(string *__return_storage_ptr__,UnknownFields *fields)

{
  variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group> *fields_00;
  byte *pbVar1;
  __index_type _Var2;
  pointer pUVar3;
  char cVar4;
  ulong uVar5;
  pointer pUVar6;
  bool bVar7;
  uint64_t swapped;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pUVar6 = (fields->super__Vector_base<UnknownField,_std::allocator<UnknownField>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pUVar3 = (fields->super__Vector_base<UnknownField,_std::allocator<UnknownField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pUVar6 != pUVar3) {
    do {
      fields_00 = &pUVar6->value;
      _Var2 = *(__index_type *)
               ((long)&(pUVar6->value).
                       super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
                       super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
               + 0x20);
      cVar4 = (char)__return_storage_ptr__;
      if (_Var2 == '\x01') {
        uVar5 = (ulong)(pUVar6->field_number << 3);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        uVar5 = *(ulong *)&(fields_00->
                           super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           ).
                           super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           ._M_u;
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        pbVar1 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p +
                         (__return_storage_ptr__->_M_string_length - 1));
        *pbVar1 = *pbVar1 | 0x80;
        std::__cxx11::string::push_back(cVar4);
      }
      else if (_Var2 == '\0') {
        uVar5 = (ulong)(pUVar6->field_number << 3);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        uVar5 = *(ulong *)&(fields_00->
                           super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           ).
                           super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           .
                           super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                           ._M_u;
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
      }
      else if (_Var2 == '\x02') {
        uVar5 = (ulong)(pUVar6->field_number * 8 + 2);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        uVar5 = *(ulong *)((long)&(pUVar6->value).
                                  super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                  .
                                  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                  .
                                  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                  .
                                  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                  .
                                  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                  .
                                  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                          + 8);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,
                   *(ulong *)&(fields_00->
                              super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              ).
                              super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              ._M_u);
      }
      else if (_Var2 == '\x04') {
        uVar5 = (ulong)(pUVar6->field_number * 8 + 5);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        local_50._M_dataplus._M_p._0_4_ =
             *(undefined4 *)
              &(fields_00->
               super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
               super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               _M_u;
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_50);
      }
      else if (_Var2 == '\x03') {
        uVar5 = (ulong)(pUVar6->field_number * 8 + 1);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        local_50._M_dataplus._M_p =
             *(pointer *)
              &(fields_00->
               super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
               super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
               _M_u;
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_50);
      }
      else if (_Var2 == '\x05') {
        uVar5 = (ulong)(pUVar6->field_number * 8 + 3);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
        ToBinaryPayload_abi_cxx11_(&local_50,(UnknownFields *)fields_00);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (ulong)(pUVar6->field_number * 8 + 4);
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar7 = 0x7f < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar7);
      }
      pUVar6 = pUVar6 + 1;
    } while (pUVar6 != pUVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryPayload(const UnknownFields& fields) {
  std::string ret;

  for (const auto& field : fields) {
    if (const auto* val = std::get_if<Varint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
    } else if (const auto* val = std::get_if<LongVarint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
      ret.back() |= 0x80;
      ret.push_back(0);
    } else if (const auto* val = std::get_if<Delimited>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Delimited, &ret);
      EncodeVarint(val->val.size(), &ret);
      ret.append(val->val);
    } else if (const auto* val = std::get_if<Fixed64>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_64Bit, &ret);
      uint64_t swapped = upb_BigEndian64(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Fixed32>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_32Bit, &ret);
      uint32_t swapped = upb_BigEndian32(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Group>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_StartGroup, &ret);
      ret.append(ToBinaryPayload(val->val));
      EncodeVarint(field.field_number << 3 | kUpb_WireType_EndGroup, &ret);
    }
  }

  return ret;
}